

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

int32_t u_parseCodePointRangeAnyTerminator
                  (char *s,uint32_t *pStart,uint32_t *pEnd,char **terminator,UErrorCode *pErrorCode)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *end;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((pStart == (uint32_t *)0x0 || s == (char *)0x0) || pEnd == (uint32_t *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pcVar3 = u_skipWhitespace(s);
      uVar4 = strtoul(pcVar3,&end,0x10);
      pcVar5 = end;
      uVar2 = (uint)uVar4;
      if (uVar2 < 0x110000 && pcVar3 < end) {
        *pEnd = uVar2;
        *pStart = uVar2;
        pcVar3 = u_skipWhitespace(end);
        if ((*pcVar3 != '.') || (pcVar3[1] != '.')) {
          *terminator = pcVar5;
          return 1;
        }
        pcVar5 = u_skipWhitespace(pcVar3 + 2);
        uVar4 = strtoul(pcVar5,&end,0x10);
        uVar2 = (uint)uVar4;
        if (uVar2 < 0x110000 && pcVar5 < end) {
          *pEnd = uVar2;
          uVar1 = *pStart;
          if (uVar1 <= uVar2) {
            *terminator = end;
            return (uVar2 - uVar1) + 1;
          }
        }
      }
      *pErrorCode = U_PARSE_ERROR;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRangeAnyTerminator(const char *s,
                                   uint32_t *pStart, uint32_t *pEnd,
                                   const char **terminator,
                                   UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || pStart==NULL || pEnd==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* read the start code point */
    s=u_skipWhitespace(s);
    value=(uint32_t)uprv_strtoul(s, &end, 16);
    if(end<=s || value>=0x110000) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }
    *pStart=*pEnd=value;

    /* is there a "..end"? */
    s=u_skipWhitespace(end);
    if(*s!='.' || s[1]!='.') {
        *terminator=end;
        return 1;
    }
    s=u_skipWhitespace(s+2);

    /* read the end code point */
    value=(uint32_t)uprv_strtoul(s, &end, 16);
    if(end<=s || value>=0x110000) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }
    *pEnd=value;

    /* is this a valid range? */
    if(value<*pStart) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }

    *terminator=end;
    return value-*pStart+1;
}